

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printCompression(Compression c)

{
  switch(c) {
  case NO_COMPRESSION:
    std::operator<<((ostream *)&std::cout,"none");
    return;
  case RLE_COMPRESSION:
    std::operator<<((ostream *)&std::cout,"run-length encoding");
    return;
  case ZIPS_COMPRESSION:
    std::operator<<((ostream *)&std::cout,"zip, individual scanlines");
    return;
  case ZIP_COMPRESSION:
    std::operator<<((ostream *)&std::cout,"zip, multi-scanline blocks");
    return;
  case PIZ_COMPRESSION:
    std::operator<<((ostream *)&std::cout,"piz");
    return;
  case PXR24_COMPRESSION:
    std::operator<<((ostream *)&std::cout,"pxr24");
    return;
  case B44_COMPRESSION:
    std::operator<<((ostream *)&std::cout,"b44");
    return;
  case B44A_COMPRESSION:
    std::operator<<((ostream *)&std::cout,"b44a");
    return;
  case DWAA_COMPRESSION:
    std::operator<<((ostream *)&std::cout,"dwa, small scanline blocks");
    return;
  case DWAB_COMPRESSION:
    std::operator<<((ostream *)&std::cout,"dwa, medium scanline blocks");
    return;
  default:
    std::ostream::operator<<(&std::cout,c);
    return;
  }
}

Assistant:

void
printCompression (Compression c)
{
    switch (c)
    {
        case NO_COMPRESSION: cout << "none"; break;

        case RLE_COMPRESSION: cout << "run-length encoding"; break;

        case ZIPS_COMPRESSION: cout << "zip, individual scanlines"; break;

        case ZIP_COMPRESSION: cout << "zip, multi-scanline blocks"; break;

        case PIZ_COMPRESSION: cout << "piz"; break;

        case PXR24_COMPRESSION: cout << "pxr24"; break;

        case B44_COMPRESSION: cout << "b44"; break;

        case B44A_COMPRESSION: cout << "b44a"; break;

        case DWAA_COMPRESSION: cout << "dwa, small scanline blocks"; break;

        case DWAB_COMPRESSION: cout << "dwa, medium scanline blocks"; break;

        default: cout << int (c); break;
    }
}